

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O0

bool __thiscall Am_Value::Valid(Am_Value *this)

{
  Am_ID_Tag AVar1;
  uint uVar2;
  double dVar3;
  Am_Value *this_local;
  
  AVar1 = Am_Type_Class(this->type);
  if (AVar1 == 0) {
    uVar2 = (uint)this->type;
    if (uVar2 - 2 < 2) {
      this_local._7_1_ = (this->value).wrapper_value != (Am_Wrapper *)0x0;
    }
    else if (uVar2 == 4) {
      this_local._7_1_ = ((this->value).char_value & 1U) != 0;
    }
    else if (uVar2 == 5) {
      this_local._7_1_ = (this->value).float_value != 0.0;
    }
    else if (uVar2 == 7) {
      this_local._7_1_ = (this->value).bool_value != false;
    }
    else {
      if (uVar2 != 9) {
        if (uVar2 == 10) {
          return (this->value).wrapper_value != (Am_Wrapper *)0x0;
        }
        if (uVar2 == 0x8006) {
          dVar3 = Am_Double_Data::operator_cast_to_double
                            ((Am_Double_Data *)(this->value).wrapper_value);
          return dVar3 != 0.0;
        }
        if (uVar2 != 0x8008) {
          return false;
        }
      }
      this_local._7_1_ = (this->value).wrapper_value != (Am_Wrapper *)0x0;
    }
  }
  else if (AVar1 == 0x1000) {
    this_local._7_1_ = false;
  }
  else if (((AVar1 == 0x2000) || (AVar1 == 0x3000)) || (AVar1 == 0x4000)) {
    this_local._7_1_ = (this->value).wrapper_value != (Am_Wrapper *)0x0;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
Am_Value::Valid() const
{
  switch (Am_Type_Class(type)) {
  case Am_ERROR_VALUE_TYPE:
    return false;
  case Am_WRAPPER:
  case Am_METHOD:
  case Am_ENUM:
    return value.voidptr_value != nullptr;
  case Am_SIMPLE_TYPE:
    switch (type) {
    case Am_STRING:
    case Am_VOIDPTR:
      return value.voidptr_value != nullptr;
    case Am_INT:
    case Am_LONG:
      return value.long_value != 0;
    case Am_BOOL:
      return value.bool_value != false;
    case Am_FLOAT:
      return value.float_value != 0.0;
    case Am_DOUBLE:
      return *(Am_Double_Data *)value.wrapper_value != 0.0;
    case Am_CHAR:
      return value.char_value != 0;
    case Am_PROC:
      return value.proc_value != nullptr;
    default:
      return false;
    }
  default:
    return false;
  }
}